

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_psbt.cpp
# Opt level: O3

void __thiscall Psbt_EmptyObject_Test::TestBody(Psbt_EmptyObject_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_2;
  Psbt empty_obj;
  AssertHelper local_d8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  AssertHelper local_c8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0 [2];
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> local_a0 [52];
  uint local_6c;
  Psbt local_68 [80];
  
  cfd::core::Psbt::Psbt(local_68);
  local_d8.data_._0_4_ = 2;
  cfd::core::Psbt::GetTransaction();
  local_6c = cfd::core::AbstractTransaction::GetVersion();
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_c8,"2","empty_obj.GetTransaction().GetVersion()",(int *)&local_d8,
             (int *)&local_6c);
  cfd::core::Transaction::~Transaction((Transaction *)&local_b0);
  if (local_c8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if (local_c0[0].ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_c0[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_psbt.cpp"
               ,0x2c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (local_b0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_b0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_b0.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_d8.data_._0_4_ = 0;
  cfd::core::Psbt::GetTransaction();
  local_6c = cfd::core::AbstractTransaction::GetLockTime();
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&local_c8,"0","empty_obj.GetTransaction().GetLockTime()",(int *)&local_d8,
             &local_6c);
  cfd::core::Transaction::~Transaction((Transaction *)&local_b0);
  if (local_c8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if (local_c0[0].ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_c0[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_psbt.cpp"
               ,0x2d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (local_b0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_b0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_b0.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_c8.data_._0_4_ = 0x13;
  local_d8.data_._0_4_ = cfd::core::Psbt::GetDataSize();
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&local_b0,"19","empty_obj.GetDataSize()",(int *)&local_c8,(uint *)&local_d8
            );
  if (local_b0.ptr_._0_1_ == (Transaction)0x0) {
    testing::Message::Message((Message *)&local_c8);
    if (local_a8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_a8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_psbt.cpp"
               ,0x2e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (CONCAT44(local_c8.data_._4_4_,local_c8.data_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)CONCAT44(local_c8.data_._4_4_,local_c8.data_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_c8.data_._4_4_,local_c8.data_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_a8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Psbt::GetData();
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_d8,"\"70736274ff01000a0200000000000000000000\"",
             "empty_obj.GetData().GetHex().c_str()","70736274ff01000a0200000000000000000000",
             (char *)local_b0.ptr_);
  if (local_b0.ptr_ != local_a0) {
    operator_delete(local_b0.ptr_);
  }
  if ((void *)CONCAT44(local_c8.data_._4_4_,local_c8.data_._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_c8.data_._4_4_,local_c8.data_._0_4_));
  }
  if (local_d8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if (local_d0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_d0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_psbt.cpp"
               ,0x30,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (local_b0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_b0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_b0.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Psbt::GetBase64_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_c8,"\"cHNidP8BAAoCAAAAAAAAAAAAAA==\"",
             "empty_obj.GetBase64().c_str()","cHNidP8BAAoCAAAAAAAAAAAAAA==",(char *)local_b0.ptr_);
  if (local_b0.ptr_ != local_a0) {
    operator_delete(local_b0.ptr_);
  }
  if (local_c8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if (local_c0[0].ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_c0[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_psbt.cpp"
               ,0x31,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (local_b0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_b0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_b0.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_c8.data_._0_4_ = 0;
  local_d8.data_._0_4_ = cfd::core::Psbt::GetPsbtVersion();
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&local_b0,"0","empty_obj.GetPsbtVersion()",(int *)&local_c8,
             (uint *)&local_d8);
  if (local_b0.ptr_._0_1_ == (Transaction)0x0) {
    testing::Message::Message((Message *)&local_c8);
    if (local_a8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_a8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_psbt.cpp"
               ,0x32,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (CONCAT44(local_c8.data_._4_4_,local_c8.data_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)CONCAT44(local_c8.data_._4_4_,local_c8.data_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_c8.data_._4_4_,local_c8.data_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_a8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Psbt::~Psbt(local_68);
  cfd::core::Psbt::Psbt(local_68,1,100);
  local_d8.data_._0_4_ = 1;
  cfd::core::Psbt::GetTransaction();
  local_6c = cfd::core::AbstractTransaction::GetVersion();
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_c8,"1","obj.GetTransaction().GetVersion()",(int *)&local_d8,
             (int *)&local_6c);
  cfd::core::Transaction::~Transaction((Transaction *)&local_b0);
  if (local_c8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if (local_c0[0].ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_c0[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_psbt.cpp"
               ,0x39,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (local_b0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_b0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_b0.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_d8.data_._0_4_ = 100;
  cfd::core::Psbt::GetTransaction();
  local_6c = cfd::core::AbstractTransaction::GetLockTime();
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&local_c8,"100","obj.GetTransaction().GetLockTime()",(int *)&local_d8,
             &local_6c);
  cfd::core::Transaction::~Transaction((Transaction *)&local_b0);
  if (local_c8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if (local_c0[0].ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_c0[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_psbt.cpp"
               ,0x3a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (local_b0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_b0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_b0.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_c8.data_._0_4_ = 0x13;
  local_d8.data_._0_4_ = cfd::core::Psbt::GetDataSize();
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&local_b0,"19","obj.GetDataSize()",(int *)&local_c8,(uint *)&local_d8);
  if (local_b0.ptr_._0_1_ == (Transaction)0x0) {
    testing::Message::Message((Message *)&local_c8);
    if (local_a8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_a8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_psbt.cpp"
               ,0x3b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (CONCAT44(local_c8.data_._4_4_,local_c8.data_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)CONCAT44(local_c8.data_._4_4_,local_c8.data_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_c8.data_._4_4_,local_c8.data_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_a8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Psbt::GetData();
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_d8,"\"70736274ff01000a0100000000006400000000\"",
             "obj.GetData().GetHex().c_str()","70736274ff01000a0100000000006400000000",
             (char *)local_b0.ptr_);
  if (local_b0.ptr_ != local_a0) {
    operator_delete(local_b0.ptr_);
  }
  if ((void *)CONCAT44(local_c8.data_._4_4_,local_c8.data_._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_c8.data_._4_4_,local_c8.data_._0_4_));
  }
  if (local_d8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if (local_d0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_d0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_psbt.cpp"
               ,0x3d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (local_b0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_b0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_b0.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Psbt::GetBase64_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_c8,"\"cHNidP8BAAoBAAAAAABkAAAAAA==\"","obj.GetBase64().c_str()",
             "cHNidP8BAAoBAAAAAABkAAAAAA==",(char *)local_b0.ptr_);
  if (local_b0.ptr_ != local_a0) {
    operator_delete(local_b0.ptr_);
  }
  if (local_c8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if (local_c0[0].ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_c0[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_psbt.cpp"
               ,0x3e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (local_b0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_b0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_b0.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Psbt::~Psbt(local_68);
  local_b0.ptr_ = local_a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,"cHNidP8BAAoBAAAAAABkAAAAAA==","");
  cfd::core::Psbt::Psbt(local_68,(string *)&local_b0);
  if (local_b0.ptr_ != local_a0) {
    operator_delete(local_b0.ptr_);
  }
  local_d8.data_._0_4_ = 1;
  cfd::core::Psbt::GetTransaction();
  local_6c = cfd::core::AbstractTransaction::GetVersion();
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_c8,"1","from_b64.GetTransaction().GetVersion()",(int *)&local_d8,
             (int *)&local_6c);
  cfd::core::Transaction::~Transaction((Transaction *)&local_b0);
  if (local_c8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if (local_c0[0].ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_c0[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_psbt.cpp"
               ,0x45,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (local_b0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_b0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_b0.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_d8.data_._0_4_ = 100;
  cfd::core::Psbt::GetTransaction();
  local_6c = cfd::core::AbstractTransaction::GetLockTime();
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&local_c8,"100","from_b64.GetTransaction().GetLockTime()",(int *)&local_d8,
             &local_6c);
  cfd::core::Transaction::~Transaction((Transaction *)&local_b0);
  if (local_c8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if (local_c0[0].ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_c0[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_psbt.cpp"
               ,0x46,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (local_b0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_b0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_b0.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_c8.data_._0_4_ = 0x13;
  local_d8.data_._0_4_ = cfd::core::Psbt::GetDataSize();
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&local_b0,"19","from_b64.GetDataSize()",(int *)&local_c8,(uint *)&local_d8)
  ;
  if (local_b0.ptr_._0_1_ == (Transaction)0x0) {
    testing::Message::Message((Message *)&local_c8);
    if (local_a8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_a8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_psbt.cpp"
               ,0x47,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (CONCAT44(local_c8.data_._4_4_,local_c8.data_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)CONCAT44(local_c8.data_._4_4_,local_c8.data_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_c8.data_._4_4_,local_c8.data_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_a8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Psbt::GetData();
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_d8,"\"70736274ff01000a0100000000006400000000\"",
             "from_b64.GetData().GetHex().c_str()","70736274ff01000a0100000000006400000000",
             (char *)local_b0.ptr_);
  if (local_b0.ptr_ != local_a0) {
    operator_delete(local_b0.ptr_);
  }
  if ((void *)CONCAT44(local_c8.data_._4_4_,local_c8.data_._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_c8.data_._4_4_,local_c8.data_._0_4_));
  }
  if (local_d8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if (local_d0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_d0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_psbt.cpp"
               ,0x49,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (local_b0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_b0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_b0.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Psbt::GetBase64_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_c8,"\"cHNidP8BAAoBAAAAAABkAAAAAA==\"","from_b64.GetBase64().c_str()"
             ,"cHNidP8BAAoBAAAAAABkAAAAAA==",(char *)local_b0.ptr_);
  if (local_b0.ptr_ != local_a0) {
    operator_delete(local_b0.ptr_);
  }
  if (local_c8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if (local_c0[0].ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_c0[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_psbt.cpp"
               ,0x4a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (local_b0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_b0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_b0.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Psbt::~Psbt(local_68);
  return;
}

Assistant:

TEST(Psbt, EmptyObject) {
  try {
    Psbt empty_obj;
    EXPECT_EQ(2, empty_obj.GetTransaction().GetVersion());
    EXPECT_EQ(0, empty_obj.GetTransaction().GetLockTime());
    EXPECT_EQ(19, empty_obj.GetDataSize());
    EXPECT_STREQ("70736274ff01000a0200000000000000000000",
        empty_obj.GetData().GetHex().c_str());
    EXPECT_STREQ("cHNidP8BAAoCAAAAAAAAAAAAAA==", empty_obj.GetBase64().c_str());
    EXPECT_EQ(0, empty_obj.GetPsbtVersion());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }

  try {
    Psbt obj(1, 100);
    EXPECT_EQ(1, obj.GetTransaction().GetVersion());
    EXPECT_EQ(100, obj.GetTransaction().GetLockTime());
    EXPECT_EQ(19, obj.GetDataSize());
    EXPECT_STREQ("70736274ff01000a0100000000006400000000",
        obj.GetData().GetHex().c_str());
    EXPECT_STREQ("cHNidP8BAAoBAAAAAABkAAAAAA==", obj.GetBase64().c_str());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }

  try {
    Psbt from_b64("cHNidP8BAAoBAAAAAABkAAAAAA==");
    EXPECT_EQ(1, from_b64.GetTransaction().GetVersion());
    EXPECT_EQ(100, from_b64.GetTransaction().GetLockTime());
    EXPECT_EQ(19, from_b64.GetDataSize());
    EXPECT_STREQ("70736274ff01000a0100000000006400000000",
        from_b64.GetData().GetHex().c_str());
    EXPECT_STREQ("cHNidP8BAAoBAAAAAABkAAAAAA==", from_b64.GetBase64().c_str());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }
}